

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O1

vector<Expr_*,_std::allocator<Expr_*>_> *
generatePhiAssignments
          (vector<Expr_*,_std::allocator<Expr_*>_> *__return_storage_ptr__,Block *blockEnding,
          Block *nextBlock)

{
  pointer *pppEVar1;
  Program *this;
  iterator __position;
  uint uVar2;
  ulong uVar3;
  Value *pVVar4;
  long lVar5;
  ulong uVar6;
  PHINode *phi;
  Value *value;
  undefined1 auVar7 [16];
  Expr *incoming;
  Expr *phiVar;
  Expr *local_48;
  Expr *local_40;
  Expr *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = blockEnding->func->program;
  auVar7 = llvm::BasicBlock::phis();
  value = auVar7._0_8_;
  while (value != auVar7._8_8_) {
    local_38 = Program::getExpr(this,value);
    uVar2 = *(uint *)(value + 0x14);
    uVar3 = (ulong)(uVar2 & 0x7ffffff);
    if ((uVar2 & 0x7ffffff) != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        if ((uVar2 >> 0x1e & 1) == 0) {
          pVVar4 = value + uVar3 * -0x20;
        }
        else {
          pVVar4 = *(Value **)(value + -8);
        }
        if (*(BasicBlock **)(pVVar4 + lVar5 + (ulong)*(uint *)(value + 0x3c) * 0x20) ==
            blockEnding->block) {
          if ((uVar2 >> 0x1e & 1) == 0) {
            pVVar4 = value + uVar3 * -0x20;
          }
          else {
            pVVar4 = *(Value **)(value + -8);
          }
          local_40 = Program::getExpr(this,*(Value **)(pVVar4 + lVar5 * 4));
          local_48 = Program::makeExpr<AssignExpr,Expr*&,Expr*&>(this,&local_38,&local_40);
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Expr*,std::allocator<Expr*>>::_M_realloc_insert<Expr*>
                      ((vector<Expr*,std::allocator<Expr*>> *)__return_storage_ptr__,__position,
                       &local_48);
          }
          else {
            *__position._M_current = local_48;
            pppEVar1 = &(__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
        }
        uVar6 = uVar6 + 1;
        uVar2 = *(uint *)(value + 0x14);
        uVar3 = (ulong)(uVar2 & 0x7ffffff);
        lVar5 = lVar5 + 8;
      } while (uVar6 < uVar3);
    }
    pVVar4 = value + 0x18;
    if (value == (Value *)0x0) {
      pVVar4 = (Value *)0x0;
    }
    value = (Value *)(*(long *)(pVVar4 + 8) + -0x18);
    if (*(long *)(pVVar4 + 8) == 0) {
      value = (Value *)0x0;
    }
    if (value[0x10] != (Value)0x52) {
      value = (Value *)0x0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Expr*> generatePhiAssignments(Block* blockEnding, Block* nextBlock) {
    std::vector<Expr*> exprs;

    Program& program = *blockEnding->func->program;

    for (const auto& phi : nextBlock->block->phis()) {
        Expr* phiVar = program.getExpr(&phi);

        // see if nextBlock declares any incoming value from blockEnding
        for (unsigned i = 0; i < phi.getNumIncomingValues(); ++i) {
            if (phi.getIncomingBlock(i) == blockEnding->block) {
                Expr* incoming = program.getExpr(phi.getIncomingValue(i));
                exprs.push_back(program.makeExpr<AssignExpr>(phiVar, incoming));
            }
        }
    }

    return exprs;
}